

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntScalarType(ValidationState_t *this,uint32_t id)

{
  Op OVar1;
  uint32_t uVar2;
  Instruction *this_00;
  undefined1 local_21;
  Instruction *inst;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  this_00 = FindDef(this,id);
  local_21 = false;
  if (this_00 != (Instruction *)0x0) {
    OVar1 = Instruction::opcode(this_00);
    local_21 = false;
    if (OVar1 == OpTypeInt) {
      uVar2 = Instruction::word(this_00,3);
      local_21 = uVar2 == 0;
    }
  }
  return local_21;
}

Assistant:

bool ValidationState_t::IsUnsignedIntScalarType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  return inst && inst->opcode() == spv::Op::OpTypeInt && inst->word(3) == 0;
}